

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O2

void summaryindex::doit(string *path,
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *eventtoperiods)

{
  _Rb_tree_color _Var1;
  int __status;
  bool bVar2;
  DIR *__dirp;
  dirent *pdVar3;
  FILE *pFVar4;
  _Base_ptr p_Var5;
  _Rb_tree_color _Var6;
  _Self __tmp;
  _Base_ptr p_Var7;
  pointer pbVar8;
  int local_ec;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string s2;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  summaryfileperiod_to_offset;
  string s3;
  
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_header;
  summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    fprintf(_stderr,"Unable to open directory %s\n",(path->_M_dataplus)._M_p);
    __status = -1;
  }
  else {
    local_ec = 0;
    while (pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0) {
      std::__cxx11::string::string((string *)&filename,pdVar3->d_name,(allocator *)&s2);
      if (4 < filename._M_string_length) {
        std::__cxx11::string::substr((ulong)&s2,(ulong)&filename);
        bVar2 = std::operator==(&s2,".bin");
        std::__cxx11::string::~string((string *)&s2);
        if (bVar2) {
          std::operator+(&s2,path,pdVar3->d_name);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&files,&filename);
          std::__cxx11::string::string((string *)&s3,(string *)&s2);
          std::__cxx11::string::erase((ulong)&s3,s2._M_string_length - 4);
          std::__cxx11::string::append((char *)&s3);
          pFVar4 = fopen(s3._M_dataplus._M_p,"r");
          if (pFVar4 == (FILE *)0x0) {
            indexevents(&s2,&summaryfileperiod_to_offset,local_ec,eventtoperiods);
          }
          else {
            fclose(pFVar4);
            indexevents(&s2,&s3,&summaryfileperiod_to_offset,local_ec,eventtoperiods);
          }
          local_ec = local_ec + 1;
          std::__cxx11::string::~string((string *)&s3);
          std::__cxx11::string::~string((string *)&s2);
        }
      }
      std::__cxx11::string::~string((string *)&filename);
    }
    std::operator+(&filename,path,"filelist.idx");
    pFVar4 = fopen(filename._M_dataplus._M_p,"wb");
    pbVar8 = files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pFVar4 != (FILE *)0x0) {
      for (; pbVar8 != files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pbVar8 = pbVar8 + 1) {
        fprintf(pFVar4,"%s\n",(pbVar8->_M_dataplus)._M_p);
      }
      fclose(pFVar4);
      std::operator+(&s2,path,"summaries.idx");
      std::__cxx11::string::operator=((string *)&filename,(string *)&s2);
      std::__cxx11::string::~string((string *)&s2);
      pFVar4 = fopen(filename._M_dataplus._M_p,"wb");
      if (pFVar4 != (FILE *)0x0) {
        _Var6 = _S_red;
        for (p_Var5 = summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left;
            (_Rb_tree_header *)p_Var5 !=
            &summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          _Var1 = p_Var5[1]._M_color;
          for (p_Var7 = p_Var5[1]._M_left; p_Var7 != p_Var5[1]._M_right;
              p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
            fprintf(pFVar4,"%d, %d, %d, %lld\n",(ulong)p_Var5[1]._M_color,
                    (ulong)*(uint *)&p_Var5[1].field_0x4,(ulong)*(uint *)&p_Var5[1]._M_parent,
                    *(undefined8 *)p_Var7);
          }
          if ((int)_Var6 < (int)_Var1) {
            _Var6 = _Var1;
          }
        }
        fclose(pFVar4);
        std::operator+(&s2,path,"max_summary_id.idx");
        std::__cxx11::string::operator=((string *)&filename,(string *)&s2);
        std::__cxx11::string::~string((string *)&s2);
        pFVar4 = fopen(filename._M_dataplus._M_p,"wb");
        if (pFVar4 != (FILE *)0x0) {
          fprintf(pFVar4,"%d",(ulong)_Var6);
          fclose(pFVar4);
          std::__cxx11::string::~string((string *)&filename);
          std::
          _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
          ::~_Rb_tree(&summaryfileperiod_to_offset._M_t);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&files);
          return;
        }
      }
    }
    fprintf(_stderr,"%s: cannot open %s\n","doit",filename._M_dataplus._M_p);
    __status = 1;
  }
  exit(__status);
}

Assistant:

void doit(const std::string& path, const std::map<int, std::vector<int>> &eventtoperiods)
{	
	std::vector<std::string> files;
	std::map<summary_period, std::vector<long long>> summaryfileperiod_to_offset;
	DIR* dir;
	struct dirent* ent;
	int file_index = 0;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				std::string s2 = path + ent->d_name;
				files.push_back(s);
				std::string s3 = s2;
				s3.erase(s2.length() - 4);
				s3 += ".idx";
				FILE * fidx = fopen(s3.c_str(), "r");
				if (fidx == nullptr) {
					indexevents(s2, summaryfileperiod_to_offset, file_index, eventtoperiods);
				} else {
					fclose(fidx);
					indexevents(s2, s3, summaryfileperiod_to_offset, file_index, eventtoperiods);
				}
				file_index++;
			}
		}
	}
	else {
		fprintf(stderr, "Unable to open directory %s\n", path.c_str());
		exit(-1);
	}

	std::string filename =  path + "filelist.idx";
	FILE* fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}
	auto iter = files.begin();
	while (iter != files.end()) {
		fprintf(fout, "%s\n", iter->c_str());
		iter++;
	}

	fclose(fout);

	int max_summary_id = 0;
	filename = path + "summaries.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	auto s_iter = summaryfileperiod_to_offset.begin();
	while (s_iter != summaryfileperiod_to_offset.end()) {
		if (s_iter->first.summary_id > max_summary_id) max_summary_id = s_iter->first.summary_id;
		auto v_iter = s_iter->second.begin();
		while (v_iter != s_iter->second.end()) {
			fprintf(fout, "%d, %d, %d, %lld\n", s_iter->first.summary_id, s_iter->first.fileindex, s_iter->first.period_no, *v_iter);
			v_iter++;
		}
		s_iter++;
	}
	fclose(fout);

	filename = path + "max_summary_id.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}
	fprintf(fout, "%d", max_summary_id);
	fclose(fout);
	
}